

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.hpp
# Opt level: O0

ContainerT * __thiscall
strq::Generator<std::__cxx11::string,void>::
random_push_backable<strq::Container<strq::Arithmetic<strq::detail::NoDistribution>>>
          (ContainerT *__return_storage_ptr__,Generator<std::__cxx11::string,void> *this,
          Container<strq::Arithmetic<strq::detail::NoDistribution>_> *schema)

{
  size_t sVar1;
  Arithmetic<strq::detail::NoDistribution> *schema_00;
  undefined4 local_30;
  int i;
  Container<strq::Arithmetic<strq::detail::NoDistribution>_> *schema_local;
  ContainerT *cont;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  Container<strq::Arithmetic<strq::detail::NoDistribution>_>::size
            ((Container<strq::Arithmetic<strq::detail::NoDistribution>_> *)this);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (local_30 = 0;
      sVar1 = Container<strq::Arithmetic<strq::detail::NoDistribution>_>::size
                        ((Container<strq::Arithmetic<strq::detail::NoDistribution>_> *)this),
      (ulong)(long)local_30 < sVar1; local_30 = local_30 + 1) {
    schema_00 = Container<strq::Arithmetic<strq::detail::NoDistribution>_>::value
                          ((Container<strq::Arithmetic<strq::detail::NoDistribution>_> *)this);
    random<char,strq::Arithmetic<strq::detail::NoDistribution>const&>(schema_00);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static auto random_push_backable(Schema&& schema) -> ContainerT
        {
            ContainerT cont;

            if constexpr (detail::trait::is_reservable <ContainerT>) {
                cont.reserve(schema.size());
            }

            for (auto i = 0; i < schema.size(); ++i) {
                cont.push_back(random<typename ContainerT::value_type>(schema.value()));
            }
            return cont;
        }